

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::WriteFrame(IMkvWriter *writer,Frame *frame,Cluster *cluster)

{
  ulong uVar1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int32 bit_count;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  uint64 value;
  ulong uVar11;
  ulong uVar12;
  uint8 b_1;
  uint8 b_2;
  uint8 b;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  uint64 local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((frame != (Frame *)0x0 && writer != (IMkvWriter *)0x0) &&
      (bVar2 = Frame::IsValid(frame), cluster != (Cluster *)0x0 && bVar2)) &&
     (cluster->timecode_scale_ != 0)) {
    uVar5 = Cluster::GetRelativeTimecode(cluster,frame->timestamp_ / cluster->timecode_scale_);
    if (0x7fff < uVar5) {
      return 0;
    }
    bVar2 = Frame::CanBeSimpleBlock(frame);
    if (bVar2) {
      iVar3 = WriteID(writer,0xa3);
      if (iVar3 == 0) {
        value = (uint64)((int)frame->length_ + 4);
        iVar3 = WriteUInt(writer,value);
        if ((iVar3 == 0) && (iVar3 = WriteUInt(writer,frame->track_number_), iVar3 == 0)) {
          lVar8 = 8;
          local_60 = value;
          do {
            local_65 = (undefined1)(uVar5 >> ((byte)lVar8 & 0x3f));
            iVar4 = (**writer->_vptr_IMkvWriter)(writer,&local_65,1);
            if (iVar4 < 0) {
              return 0;
            }
            lVar8 = lVar8 + -8;
          } while (lVar8 != -8);
          if (frame->is_key_ == true) {
            puVar10 = &local_61;
            local_61 = 0x80;
          }
          else {
            puVar10 = &local_63;
            local_63 = 0;
          }
          iVar4 = (**writer->_vptr_IMkvWriter)(writer,puVar10,1);
          if ((-1 < iVar4) &&
             (iVar4 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_)
             , iVar4 == 0)) {
            lVar8 = 6;
            if ((0x7e < local_60) &&
               ((((lVar8 = 7, 0x3ffe < local_60 && (lVar8 = 8, 0x1ffffe < local_60)) &&
                 (lVar8 = 9, 0xffffffe < local_60)) &&
                ((lVar8 = 10, 0x7fffffffe < local_60 && (lVar8 = 0xb, 0x3fffffffffe < local_60))))))
            {
              lVar8 = 0xd - (ulong)(local_60 < 0x1ffffffffffff);
            }
            return lVar8 + frame->length_;
          }
        }
      }
    }
    else {
      uVar1 = cluster->timecode_scale_;
      if (frame->additional_ == (uint8_t *)0x0) {
        local_60 = 0;
        lVar8 = 0;
        local_38 = 0;
      }
      else {
        uVar12 = frame->additional_length_;
        lVar8 = 1;
        if ((((0x7e < uVar12) && (lVar8 = 2, 0x3ffe < uVar12)) &&
            ((lVar8 = 3, 0x1ffffe < uVar12 &&
             ((lVar8 = 4, 0xffffffe < uVar12 && (lVar8 = 5, 0x7fffffffe < uVar12)))))) &&
           (lVar8 = 6, 0x3fffffffffe < uVar12)) {
          lVar8 = 8 - (ulong)(uVar12 < 0x1ffffffffffff);
        }
        uVar11 = frame->add_id_;
        lVar7 = 3;
        if (((((0xff < uVar11) && (lVar7 = 4, 0xffff < uVar11)) && (lVar7 = 5, 0xffffff < uVar11))
            && ((lVar7 = 6, uVar11 >> 0x20 != 0 && (lVar7 = 7, uVar11 >> 0x28 != 0)))) &&
           (lVar7 = 8, uVar11 >> 0x30 != 0)) {
          lVar7 = 10 - (ulong)(uVar11 >> 0x38 == 0);
        }
        local_38 = uVar12 + 1 + lVar8 + lVar7;
        lVar8 = 2;
        if (((0x7e < local_38) && (lVar8 = 3, 0x3ffe < local_38)) &&
           ((lVar8 = 4, 0x1ffffe < local_38 &&
            (((lVar8 = 5, 0xffffffe < local_38 && (lVar8 = 6, 0x7fffffffe < local_38)) &&
             (lVar8 = 7, 0x3fffffffffe < local_38)))))) {
          lVar8 = 9 - (ulong)(local_38 < 0x1ffffffffffff);
        }
        local_60 = lVar8 + local_38;
        lVar8 = 3;
        if ((((0x7e < local_60) && (lVar8 = 4, 0x3ffe < local_60)) &&
            ((lVar8 = 5, 0x1ffffe < local_60 &&
             ((lVar8 = 6, 0xffffffe < local_60 && (lVar8 = 7, 0x7fffffffe < local_60)))))) &&
           (lVar8 = 8, 0x3fffffffffe < local_60)) {
          lVar8 = 10 - (ulong)(local_60 < 0x1ffffffffffff);
        }
        lVar8 = lVar8 + local_60;
      }
      if (frame->discard_padding_ == 0) {
        uVar12 = 0;
      }
      else {
        iVar3 = GetIntSize(frame->discard_padding_);
        uVar12 = (ulong)(iVar3 + 3);
      }
      lVar7 = 0;
      local_50 = (ulong)frame->reference_block_timestamp_ / uVar1;
      if (((((frame->is_key_ == false) && (lVar7 = 3, 0xff < local_50)) &&
           (lVar7 = 4, 0xffff < local_50)) &&
          ((lVar7 = 5, 0xffffff < local_50 && (lVar7 = 6, local_50 >> 0x20 != 0)))) &&
         ((lVar7 = 7, local_50 >> 0x28 != 0 && (lVar7 = 8, local_50 >> 0x30 != 0)))) {
        lVar7 = 10 - (ulong)(local_50 >> 0x38 == 0);
      }
      local_48 = frame->duration_;
      lVar9 = 0;
      local_58 = local_48 / uVar1;
      if (((uVar1 <= local_48) && (lVar9 = 3, 0xff < local_58)) &&
         ((lVar9 = 4, 0xffff < local_58 &&
          ((((lVar9 = 5, 0xffffff < local_58 && (lVar9 = 6, local_58 >> 0x20 != 0)) &&
            (lVar9 = 7, local_58 >> 0x28 != 0)) && (lVar9 = 8, local_58 >> 0x30 != 0)))))) {
        lVar9 = 10 - (ulong)(local_58 >> 0x38 == 0);
      }
      uVar11 = frame->length_ + 4;
      lVar6 = 2;
      if (((0x7e < uVar11) && (lVar6 = 3, 0x3ffe < uVar11)) &&
         (((lVar6 = 4, 0x1ffffe < uVar11 &&
           ((lVar6 = 5, 0xffffffe < uVar11 && (lVar6 = 6, 0x7fffffffe < uVar11)))) &&
          (lVar6 = 7, 0x3fffffffffe < uVar11)))) {
        lVar6 = 9 - (ulong)(uVar11 < 0x1ffffffffffff);
      }
      uVar12 = lVar7 + lVar9 + uVar12 + lVar8 + lVar6 + uVar11;
      local_40 = uVar1;
      bVar2 = WriteEbmlMasterElement(writer,0xa0,uVar12);
      if (((bVar2) && (bVar2 = WriteEbmlMasterElement(writer,0xa1,uVar11), bVar2)) &&
         (iVar3 = WriteUInt(writer,frame->track_number_), iVar3 == 0)) {
        lVar8 = 8;
        do {
          local_64 = (undefined1)(uVar5 >> ((byte)lVar8 & 0x3f));
          iVar4 = (**writer->_vptr_IMkvWriter)(writer,&local_64,1);
          if (iVar4 < 0) {
            return 0;
          }
          lVar8 = lVar8 + -8;
        } while (lVar8 != -8);
        local_62 = 0;
        iVar4 = (**writer->_vptr_IMkvWriter)(writer,&local_62,1);
        if ((-1 < iVar4) &&
           (iVar4 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_),
           iVar4 == 0)) {
          if (frame->additional_ != (uint8_t *)0x0) {
            bVar2 = WriteEbmlMasterElement(writer,0x75a1,local_60);
            if (!bVar2) {
              return 0;
            }
            bVar2 = WriteEbmlMasterElement(writer,0xa6,local_38);
            if (!bVar2) {
              return 0;
            }
            bVar2 = WriteEbmlElement(writer,0xee,frame->add_id_,0);
            if (!bVar2) {
              return 0;
            }
            bVar2 = WriteEbmlElement(writer,0xa5,frame->additional_,frame->additional_length_);
            if (!bVar2) {
              return 0;
            }
          }
          if ((frame->discard_padding_ == 0) ||
             (bVar2 = WriteEbmlElement(writer,0x75a2,frame->discard_padding_), bVar2)) {
            if ((frame->is_key_ == false) &&
               (bVar2 = WriteEbmlElement(writer,0xfb,local_50,0), !bVar2)) {
              return 0;
            }
            if ((local_40 <= local_48) && (bVar2 = WriteEbmlElement(writer,0x9b,local_58,0), !bVar2)
               ) {
              return 0;
            }
            lVar8 = 2;
            if ((((0x7e < uVar12) && (lVar8 = 3, 0x3ffe < uVar12)) && (lVar8 = 4, 0x1ffffe < uVar12)
                ) && (((lVar8 = 5, 0xffffffe < uVar12 && (lVar8 = 6, 0x7fffffffe < uVar12)) &&
                      (lVar8 = 7, 0x3fffffffffe < uVar12)))) {
              lVar8 = 9 - (ulong)(uVar12 < 0x1ffffffffffff);
            }
            return lVar8 + uVar12;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteFrame(IMkvWriter* writer, const Frame* const frame,
                  Cluster* cluster) {
  if (!writer || !frame || !frame->IsValid() || !cluster ||
      !cluster->timecode_scale())
    return 0;

  //  Technically the timecode for a block can be less than the
  //  timecode for the cluster itself (remember that block timecode
  //  is a signed, 16-bit integer).  However, as a simplification we
  //  only permit non-negative cluster-relative timecodes for blocks.
  const int64 relative_timecode = cluster->GetRelativeTimecode(
      frame->timestamp() / cluster->timecode_scale());
  if (relative_timecode < 0 || relative_timecode > kMaxBlockTimecode)
    return 0;

  return frame->CanBeSimpleBlock()
             ? WriteSimpleBlock(writer, frame, relative_timecode)
             : WriteBlock(writer, frame, relative_timecode,
                          cluster->timecode_scale());
}